

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_6::GetGPrimPropertyNamesImpl
               (GPrim *gprim,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *prop_names,bool attr_prop,bool rel_prop)

{
  pointer pXVar1;
  long lVar2;
  GPrim *pGVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  undefined7 in_register_00000011;
  OpType *extraout_RDX;
  OpType *extraout_RDX_00;
  OpType *extraout_RDX_01;
  OpType *op;
  XformOp *xop;
  pointer this;
  byte bVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *__range3;
  string varname;
  string rel_name;
  allocator local_111;
  GPrim *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined4 local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (gprim != (GPrim *)0x0) {
    local_110 = gprim;
    if (attr_prop) {
      bVar4 = TypedAttributeWithFallback<bool>::authored(&gprim->doubleSided);
      if (bVar4) {
        ::std::__cxx11::string::string((string *)&local_108,"doubleSided",(allocator *)&local_e0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_108);
        ::std::__cxx11::string::_M_dispose();
      }
      bVar4 = TypedAttributeWithFallback<tinyusdz::Orientation>::authored(&gprim->orientation);
      if (bVar4) {
        ::std::__cxx11::string::string((string *)&local_108,"orientation",(allocator *)&local_e0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_108);
        ::std::__cxx11::string::_M_dispose();
      }
      bVar4 = TypedAttributeWithFallback<tinyusdz::Purpose>::authored(&gprim->purpose);
      if (bVar4) {
        ::std::__cxx11::string::string((string *)&local_108,"purpose",(allocator *)&local_e0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_108);
        ::std::__cxx11::string::_M_dispose();
      }
      bVar4 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::authored(&gprim->extent);
      if (bVar4) {
        ::std::__cxx11::string::string((string *)&local_108,"extent",(allocator *)&local_e0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_108);
        ::std::__cxx11::string::_M_dispose();
      }
      bVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::authored
                        (&gprim->visibility);
      op = extraout_RDX;
      if (bVar4) {
        ::std::__cxx11::string::string((string *)&local_108,"visibility",(allocator *)&local_e0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_108);
        ::std::__cxx11::string::_M_dispose();
        op = extraout_RDX_00;
      }
      pXVar1 = (gprim->super_Xformable).xformOps.
               super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this = (gprim->super_Xformable).xformOps.
                  super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
                  super__Vector_impl_data._M_start; this != pXVar1; this = this + 1) {
        if (this->op_type != ResetXformStack) {
          tinyusdz::to_string_abi_cxx11_(&local_108,(tinyusdz *)this,op);
          if ((this->suffix)._M_string_length != 0) {
            ::std::operator+(&local_e0,":",&this->suffix);
            ::std::__cxx11::string::append((string *)&local_108);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(prop_names,&local_108);
          ::std::__cxx11::string::_M_dispose();
          op = extraout_RDX_01;
        }
      }
    }
    pGVar3 = local_110;
    if ((local_110->super_MaterialBinding).materialBinding.has_value_ == true) {
      ::std::__cxx11::string::string((string *)&local_108,"material:binding",(allocator *)&local_e0)
      ;
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                 &local_108);
      ::std::__cxx11::string::_M_dispose();
    }
    if ((pGVar3->super_MaterialBinding).materialBindingPreview.has_value_ == true) {
      ::std::__cxx11::string::string
                ((string *)&local_108,"material:binding:preview",(allocator *)&local_e0);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                 &local_108);
      ::std::__cxx11::string::_M_dispose();
    }
    if ((pGVar3->super_MaterialBinding).materialBindingFull.has_value_ == true) {
      ::std::__cxx11::string::string
                ((string *)&local_108,"material:binding:full",(allocator *)&local_e0);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                 &local_108);
      ::std::__cxx11::string::_M_dispose();
    }
    for (p_Var5 = (pGVar3->super_MaterialBinding)._materialBindingMap._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 !=
        &(pGVar3->super_MaterialBinding)._materialBindingMap._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
      ::std::operator+(&local_108,"material:binding:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var5 + 1));
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                 &local_108);
      ::std::__cxx11::string::_M_dispose();
    }
    local_e4 = (undefined4)CONCAT71(in_register_00000011,attr_prop);
    local_c0 = &(local_110->super_MaterialBinding)._materialBindingCollectionMap._M_t._M_impl.
                super__Rb_tree_header._M_header;
    for (p_Var5 = (local_110->super_MaterialBinding)._materialBindingCollectionMap._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_left; gprim = local_110, p_Var5 != local_c0;
        p_Var5 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      if (p_Var5[1]._M_parent != (_Base_ptr)0x0) {
        ::std::operator+(&local_e0,":",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var5 + 1));
        ::std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
        ::std::__cxx11::string::_M_dispose();
      }
      lVar7 = 0;
      local_b8 = p_Var5;
      for (uVar8 = 0; uVar8 < *(ulong *)(p_Var5 + 4); uVar8 = uVar8 + 1) {
        lVar2 = *(long *)(p_Var5 + 2);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        local_e0._M_string_length = 0;
        local_e0.field_2._M_local_buf[0] = '\0';
        if (p_Var5[1]._M_parent == (_Base_ptr)0x0) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_90,"material:binding:collection",&local_108);
          ::std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_90);
        }
        else {
          ::std::__cxx11::string::string((string *)&local_b0,":",&local_111);
          ::std::operator+(&local_70,"material:binding:collection",&local_b0);
          ::std::operator+(&local_50,&local_70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (lVar2 + lVar7));
          ::std::operator+(&local_90,&local_50,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_108);
          ::std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_90);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          p_Var5 = local_b8;
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::string::_M_dispose();
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(prop_names,&local_e0);
        ::std::__cxx11::string::_M_dispose();
        lVar7 = lVar7 + 0x20;
      }
      ::std::__cxx11::string::_M_dispose();
    }
    if ((local_110->proxyPrim)._authored != false) {
      ::std::__cxx11::string::string((string *)&local_108,"proxyPrim",(allocator *)&local_e0);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                 &local_108);
      ::std::__cxx11::string::_M_dispose();
    }
    bVar6 = (byte)local_e4;
    for (p_Var5 = (gprim->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(gprim->props)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
      if ((((ulong)p_Var5[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000 & (bVar6 ^ 1)) == 0)
      {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(prop_names,(value_type *)(p_Var5 + 1));
      }
    }
  }
  return gprim != (GPrim *)0x0;
}

Assistant:

bool GetGPrimPropertyNamesImpl(const GPrim *gprim,
                               std::vector<std::string> *prop_names,
                               bool attr_prop, bool rel_prop) {
  if (!gprim) {
    return false;
  }

  if (!prop_names) {
    return false;
  }

  if (attr_prop) {
    if (gprim->doubleSided.authored()) {
      prop_names->push_back("doubleSided");
    }

    if (gprim->orientation.authored()) {
      prop_names->push_back("orientation");
    }

    if (gprim->purpose.authored()) {
      prop_names->push_back("purpose");
    }

    if (gprim->extent.authored()) {
      prop_names->push_back("extent");
    }

    if (gprim->visibility.authored()) {
      prop_names->push_back("visibility");
    }

    // xformOps.
    for (const auto &xop : gprim->xformOps) {
      if (xop.op_type == XformOp::OpType::ResetXformStack) {
        // skip
        continue;
      }
      std::string varname = to_string(xop.op_type);
      if (!xop.suffix.empty()) {
        varname += ":" + xop.suffix;
      }
      prop_names->push_back(varname);
    }
  }

  if (rel_prop) {
    if (gprim->materialBinding) {
      prop_names->push_back(kMaterialBinding);
    }

    if (gprim->materialBindingPreview) {
      prop_names->push_back(kMaterialBindingPreview);
    }

    if (gprim->materialBindingFull) {
      prop_names->push_back(kMaterialBindingFull);
    }

    for (const auto &item : gprim->materialBindingMap()) {
      prop_names->push_back("material:binding:" + item.first);
    }

    for (const auto &collection : gprim->materialBindingCollectionMap()) {
      std::string purpose_name;
      if (!collection.first.empty()) {
        purpose_name = ":" + collection.first;
      }

      for (size_t i = 0; i < collection.second.size(); i++) {
        const std::string &coll_name = collection.second.keys()[i];
        std::string rel_name;
        if (collection.first.empty()) {
          rel_name = kMaterialBindingCollection + purpose_name;
        } else {
          rel_name = kMaterialBindingCollection + std::string(":") + coll_name +
                     purpose_name;
        }

        prop_names->push_back(rel_name);
      }
    }

    if (gprim->proxyPrim.authored()) {
      prop_names->push_back("proxyPrim");
    }
  }

  // other props
  for (const auto &prop : gprim->props) {
    if (prop.second.is_relationship()) {
      if (rel_prop) {
        prop_names->push_back(prop.first);
      }
    } else {  // assume attribute
      if (attr_prop) {
        prop_names->push_back(prop.first);
      }
    }
  }

  return true;
}